

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::test_case_exception
          (ConsoleReporter *this,TestCaseException *e)

{
  TestCaseData *pTVar1;
  ostream *poVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  TestCaseData *pTVar8;
  uint uVar9;
  long lVar10;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar3 == 0) {
    if (this->tc->m_no_output == false) {
      logTestStart(this);
      pTVar1 = this->tc;
      pTVar8 = pTVar1;
      if ((pTVar1->m_file).field_0.buf[0x17] < '\0') {
        pTVar8 = (TestCaseData *)(pTVar1->m_file).field_0.data.ptr;
      }
      pcVar4 = " ";
      (*(this->super_IReporter)._vptr_IReporter[0xe])(this,pTVar8,(ulong)pTVar1->m_line);
      successOrFailColoredStringToStream(this,false,(uint)e->is_crash * 2 + is_check,pcVar4);
      poVar2 = this->s;
      Color::operator<<(poVar2,Red);
      pcVar4 = "test case THREW exception: ";
      if (e->is_crash != false) {
        pcVar4 = "test case CRASHED: ";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,pcVar4,(ulong)(e->is_crash ^ 1) * 8 + 0x13);
      Color::operator<<(poVar2,Cyan);
      doctest::operator<<(poVar2,&e->error_string);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      uVar9 = (int)(*(long *)(detail::g_cs + 0x1100) - *(long *)(detail::g_cs + 0x10f8) >> 3) *
              -0x55555555;
      if (uVar9 != 0) {
        lVar6 = *(long *)(detail::g_cs + 0x10f8);
        if (uVar9 == 0) {
          lVar6 = 0;
        }
        poVar2 = this->s;
        Color::operator<<(poVar2,None);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  logged: ",10);
        if (0 < (int)uVar9) {
          lVar10 = (ulong)(uVar9 & 0x7fffffff) + 1;
          lVar7 = 0;
          do {
            pcVar4 = "          ";
            if (lVar7 == 0) {
              pcVar4 = "";
            }
            poVar2 = this->s;
            lVar5 = 10;
            if (lVar7 == 0) {
              lVar5 = 0;
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar5);
            doctest::operator<<(poVar2,(String *)
                                       (lVar7 + lVar6 + (ulong)(uVar9 & 0x7fffffff) * 0x18 + -0x18))
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
            lVar10 = lVar10 + -1;
            lVar7 = lVar7 + -0x18;
          } while (1 < lVar10);
        }
      }
      poVar2 = this->s;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      Color::operator<<(poVar2,None);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            std::lock_guard<std::mutex> lock(mutex);
            if(tc->m_no_output)
                return;

            logTestStart();

            file_line_to_stream(tc->m_file.c_str(), tc->m_line, " ");
            successOrFailColoredStringToStream(false, e.is_crash ? assertType::is_require :
                                                                   assertType::is_check);
            s << Color::Red << (e.is_crash ? "test case CRASHED: " : "test case THREW exception: ")
              << Color::Cyan << e.error_string << "\n";

            int num_stringified_contexts = get_num_stringified_contexts();
            if(num_stringified_contexts) {
                auto stringified_contexts = get_stringified_contexts();
                s << Color::None << "  logged: ";
                for(int i = num_stringified_contexts; i > 0; --i) {
                    s << (i == num_stringified_contexts ? "" : "          ")
                      << stringified_contexts[i - 1] << "\n";
                }
            }
            s << "\n" << Color::None;
        }